

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall wabt::LocalTypes::Set(LocalTypes *this,TypeVector *types)

{
  pointer ppVar1;
  pointer pTVar2;
  pointer pTVar3;
  Enum EVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  Type type;
  undefined8 local_38;
  
  ppVar1 = (this->decls_).
           super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->decls_).
      super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    (this->decls_).
    super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar2 != pTVar3) {
    EVar4 = pTVar2->enum_;
    local_38 = CONCAT44(EVar4,1);
    if (4 < (ulong)((long)pTVar3 - (long)pTVar2)) {
      uVar7 = 1;
      iVar6 = 1;
      uVar5 = 2;
      do {
        if (pTVar2[uVar7].enum_ == EVar4) {
          iVar6 = iVar6 + 1;
        }
        else {
          std::
          vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
          ::emplace_back<wabt::Type&,unsigned_int&>
                    ((vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
                      *)this,(Type *)((long)&local_38 + 4),(uint *)&local_38);
          pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          EVar4 = pTVar2[uVar7].enum_;
          local_38 = (ulong)(uint)EVar4 << 0x20;
          pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          iVar6 = 1;
        }
        local_38 = CONCAT44(local_38._4_4_,iVar6);
        uVar7 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar7 < (ulong)((long)pTVar3 - (long)pTVar2 >> 2));
    }
    std::
    vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>::
    emplace_back<wabt::Type&,unsigned_int&>
              ((vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
                *)this,(Type *)((long)&local_38 + 4),(uint *)&local_38);
  }
  return;
}

Assistant:

void LocalTypes::Set(const TypeVector& types) {
  decls_.clear();
  if (types.empty()) {
    return;
  }

  Type type = types[0];
  Index count = 1;
  for (Index i = 1; i < types.size(); ++i) {
    if (types[i] != type) {
      decls_.emplace_back(type, count);
      type = types[i];
      count = 1;
    } else {
      ++count;
    }
  }
  decls_.emplace_back(type, count);
}